

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

size_t coda_strnspn(char *s,char *n,size_t len)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *p;
  char *pcVar5;
  bool bVar6;
  
  pcVar4 = s;
  if (0 < (long)len) {
    cVar1 = *n;
    pcVar3 = s;
    while (pcVar4 = s, cVar1 != '\0') {
      bVar6 = cVar1 == '\0';
      pcVar5 = n + 1;
      cVar2 = cVar1;
      while (pcVar4 = pcVar3, *pcVar3 != cVar2) {
        cVar2 = *pcVar5;
        bVar6 = cVar2 == '\0';
        if (bVar6) goto LAB_00105433;
        pcVar5 = pcVar5 + 1;
      }
      if ((bVar6) || (pcVar3 = pcVar3 + 1, pcVar4 = pcVar3, s + len <= pcVar3)) break;
    }
  }
LAB_00105433:
  return (long)pcVar4 - (long)s;
}

Assistant:

size_t coda_strnspn(const char *s, const char *n, size_t len)
{
	const char *p = s;
	const char *e = s + len;
	const char *x;

	for (; p < e; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) break;
		}

		if (!*x) break;
	}

	return p - s;
}